

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

CloudNode * cloudBddAnd(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  CloudNode *pCVar1;
  CloudNode *pCVar2;
  CloudCacheEntry2 *pCVar3;
  CloudManager *local_88;
  CloudVar local_7c;
  CloudNode *pCStack_78;
  CloudVar var;
  CloudNode *e;
  CloudNode *t;
  CloudNode *gnv;
  CloudNode *gv;
  CloudNode *fnv;
  CloudNode *fv;
  CloudCacheEntry2 *cacheEntry;
  CloudNode *r;
  CloudNode *G;
  CloudNode *F;
  CloudNode *g_local;
  CloudNode *f_local;
  CloudManager *dd_local;
  
  if (g < f) {
    __assert_fail("f <= g",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                  ,0x15e,"CloudNode *cloudBddAnd(CloudManager *, CloudNode *, CloudNode *)");
  }
  pCVar1 = (CloudNode *)((ulong)f & 0xfffffffffffffffe);
  pCVar2 = (CloudNode *)((ulong)g & 0xfffffffffffffffe);
  dd_local = (CloudManager *)f;
  if (pCVar1 == pCVar2) {
    if (f != g) {
      dd_local = (CloudManager *)dd->zero;
    }
  }
  else if (pCVar1 == dd->one) {
    if (f == dd->one) {
      dd_local = (CloudManager *)g;
    }
  }
  else {
    pCVar3 = dd->tCaches[0] +
             ((uint)(((int)f * 0xc00005 + (int)g) * 0x40f1f9) >> ((byte)dd->shiftCache[0] & 0x1f));
    if (((pCVar3->s == dd->nSignCur) && (pCVar3->a == f)) && (pCVar3->b == g)) {
      local_88 = (CloudManager *)pCVar3->r;
    }
    else {
      local_88 = (CloudManager *)0x0;
    }
    if (local_88 == (CloudManager *)0x0) {
      dd->nCacheMisses = dd->nCacheMisses + 1;
      if (pCVar2->v < pCVar1->v) {
        local_7c = pCVar2->v;
        gv = f;
        fnv = f;
      }
      else {
        local_7c = pCVar1->v;
        if (((ulong)f & 1) == 0) {
          gv = pCVar1->e;
          fnv = pCVar1->t;
        }
        else {
          gv = (CloudNode *)((ulong)pCVar1->e ^ 1);
          fnv = (CloudNode *)((ulong)pCVar1->t ^ 1);
        }
      }
      t = g;
      gnv = g;
      if (pCVar2->v <= pCVar1->v) {
        if (((ulong)g & 1) == 0) {
          t = pCVar2->e;
          gnv = pCVar2->t;
        }
        else {
          t = (CloudNode *)((ulong)pCVar2->e ^ 1);
          gnv = (CloudNode *)((ulong)pCVar2->t ^ 1);
        }
      }
      if (gnv < fnv) {
        e = cloudBddAnd(dd,gnv,fnv);
      }
      else {
        e = cloudBddAnd(dd,fnv,gnv);
      }
      if (e == (CloudNode *)0x0) {
        dd_local = (CloudManager *)0x0;
      }
      else {
        if (t < gv) {
          pCStack_78 = cloudBddAnd(dd,t,gv);
        }
        else {
          pCStack_78 = cloudBddAnd(dd,gv,t);
        }
        if (pCStack_78 == (CloudNode *)0x0) {
          dd_local = (CloudManager *)0x0;
        }
        else {
          if (e == pCStack_78) {
            cacheEntry = (CloudCacheEntry2 *)e;
          }
          else if (((ulong)e & 1) == 0) {
            cacheEntry = (CloudCacheEntry2 *)cloudMakeNode(dd,local_7c,e,pCStack_78);
            if (cacheEntry == (CloudCacheEntry2 *)0x0) {
              return (CloudNode *)0x0;
            }
          }
          else {
            pCVar1 = cloudMakeNode(dd,local_7c,(CloudNode *)((ulong)e ^ 1),
                                   (CloudNode *)((ulong)pCStack_78 ^ 1));
            if (pCVar1 == (CloudNode *)0x0) {
              return (CloudNode *)0x0;
            }
            cacheEntry = (CloudCacheEntry2 *)((ulong)pCVar1 ^ 1);
          }
          pCVar3->s = dd->nSignCur;
          pCVar3->a = f;
          pCVar3->b = g;
          pCVar3->r = (CloudNode *)cacheEntry;
          dd_local = (CloudManager *)cacheEntry;
        }
      }
    }
    else {
      dd->nCacheHits = dd->nCacheHits + 1;
      dd_local = local_88;
    }
  }
  return (CloudNode *)dd_local;
}

Assistant:

CloudNode * cloudBddAnd( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    CloudNode * F, * G, * r;
    CloudCacheEntry2 * cacheEntry;
    CloudNode * fv, * fnv, * gv, * gnv, * t, * e;
    CloudVar  var;

    assert( f <= g );

    // terminal cases
    F = Cloud_Regular(f);
    G = Cloud_Regular(g);
    if ( F == G )
    {
        if ( f == g )
            return f;
        else
            return dd->zero;
    }
    if ( F == dd->one )
    {
        if ( f == dd->one )
            return g;
        else
            return f;
    }

    // check cache
    cacheEntry = dd->tCaches[CLOUD_OPER_AND] + cloudHashCudd2(f, g, dd->shiftCache[CLOUD_OPER_AND]);
//    cacheEntry = dd->tCaches[CLOUD_OPER_AND] + cloudHashBuddy2(f, g, dd->shiftCache[CLOUD_OPER_AND]);
    r = cloudCacheLookup2( cacheEntry, dd->nSignCur, f, g );
    if ( r != NULL )
    {
        dd->nCacheHits++;
        return r;
    }
    dd->nCacheMisses++;


    // compute cofactors
    if ( cloudV(F) <= cloudV(G) )
    {
        var = cloudV(F);
        if ( Cloud_IsComplement(f) )
        {
            fnv = Cloud_Not(cloudE(F));
            fv  = Cloud_Not(cloudT(F));
        }
        else
        {
            fnv = cloudE(F);
            fv  = cloudT(F);
        }
    }
    else
    {
        var = cloudV(G);
        fv  = fnv = f;
    }

    if ( cloudV(G) <= cloudV(F) )
    {
        if ( Cloud_IsComplement(g) )
        {
            gnv = Cloud_Not(cloudE(G));
            gv  = Cloud_Not(cloudT(G));
        }
        else
        {
            gnv = cloudE(G);
            gv  = cloudT(G);
        }
    }
    else
    {
        gv = gnv = g;
    }

    if ( fv <= gv )
        t = cloudBddAnd( dd, fv, gv );
    else
        t = cloudBddAnd( dd, gv, fv );

    if ( t == NULL )
        return NULL;

    if ( fnv <= gnv )
        e = cloudBddAnd( dd, fnv, gnv );
    else
        e = cloudBddAnd( dd, gnv, fnv );

    if ( e == NULL )
        return NULL;

    if ( t == e )
        r = t;
    else
    {
        if ( Cloud_IsComplement(t) )
        {
            r = cloudMakeNode( dd, var, Cloud_Not(t), Cloud_Not(e) );
            if ( r == NULL )
                return NULL;
            r = Cloud_Not(r);
        }
        else
        {
            r = cloudMakeNode( dd, var, t, e );
            if ( r == NULL )
                return NULL;
        }
    }
    cloudCacheInsert2( cacheEntry, dd->nSignCur, f, g, r );
    return r;
}